

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O2

int forkfd_wait4(int ffd,forkfd_info *info,int options,rusage *rusage)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  ssize_t sVar4;
  rusage *in_R8;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  pipe_payload payload;
  undefined1 *local_b8;
  undefined8 uStack_b0;
  undefined1 *local_a8;
  undefined8 uStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&payload,0xaa,0x98);
  if (0 < system_forkfd_state) {
    uVar5 = (options & 2U) * 0x800000;
    uVar6 = (options & 1U) + uVar5 + 4;
    uVar7 = uVar6;
    if ((options & 1U) == 0) {
      uVar1 = fcntl(ffd,3);
      if (uVar1 != 0xffffffff) {
        uVar7 = uVar5 | 5;
        if ((uVar1 >> 0xb & 1) == 0) {
          uVar7 = uVar6;
        }
        goto LAB_003e61dd;
      }
    }
    else {
LAB_003e61dd:
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_b0 = 0xaaaaaaaa00000000;
      uStack_a0 = 0xaaaaaaaa00000000;
      iVar2 = sys_waitid(ffd,(int)&local_b8,(siginfo_t *)(ulong)uVar7,(int)rusage,in_R8);
      if (info != (forkfd_info *)0x0) {
        info->code = (int32_t)uStack_b0;
        info->status = (int32_t)uStack_a0;
      }
      if (iVar2 != -1) goto LAB_003e628e;
    }
    piVar3 = __errno_location();
    iVar2 = -1;
    if (*piVar3 != 9) goto LAB_003e628e;
  }
  iVar2 = -1;
  sVar4 = read(ffd,&payload,0x98);
  if ((int)sVar4 != -1) {
    if (info != (forkfd_info *)0x0) {
      *info = payload.info;
    }
    iVar2 = 0;
    if (rusage != (rusage *)0x0) {
      memcpy(rusage,&payload.rusage,0x90);
    }
  }
LAB_003e628e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int forkfd_wait4(int ffd, struct forkfd_info *info, int options, struct rusage *rusage)
{
    struct pipe_payload payload;
    int ret;

    if (system_has_forkfd()) {
        /* if this is one of our pipes, not a procdesc/pidfd, we'll get an EBADF */
        ret = system_forkfd_wait(ffd, info, options, rusage);
        if (disable_fork_fallback() || ret != -1 || errno != EBADF)
            return ret;
    }

    ret = read(ffd, &payload, sizeof(payload));
    if (ret == -1)
        return ret;     /* pass errno, probably EINTR, EBADF or EWOULDBLOCK */

    assert(ret == sizeof(payload));
    if (info)
        *info = payload.info;
    if (rusage)
        *rusage = payload.rusage;

    return 0;           /* success */
}